

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmr.cpp
# Opt level: O3

bool __thiscall
DSDcc::DSDDMR::processVoiceEmbeddedSignalling
          (DSDDMR *this,int *voiceEmbSig_dibitsIndex,uchar *voiceEmbSigRawBits,bool *voiceEmbSig_OK,
          DMRAddresses *addresses)

{
  int iVar1;
  bool bVar2;
  ulong uVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  
  if (this->m_lcss == '\0') {
    return false;
  }
  iVar6 = *voiceEmbSig_dibitsIndex;
  uVar3 = 0;
  bVar4 = 0;
  do {
    if (0x3f < iVar6) break;
    iVar1 = *(int *)(m_embSigInterleave + (long)(iVar6 * 2) * 4);
    iVar6 = *(int *)(m_embSigInterleave + (long)(iVar6 * 2 + 1) * 4);
    uVar7 = (uint)uVar3 & 3;
    voiceEmbSigRawBits[iVar1] = this->m_voiceEmbSig_dibits[uVar3] >> 1 & 1;
    bVar5 = this->m_voiceEmbSig_dibits[uVar3] & 1;
    if ((uVar3 & 3) == 0) {
      bVar4 = (byte)uVar7;
    }
    voiceEmbSigRawBits[iVar6] = bVar5;
    if ((uVar7 == 3) && ((bVar4 ^ voiceEmbSigRawBits[iVar1]) != bVar5)) {
      *voiceEmbSig_OK = false;
      iVar6 = *voiceEmbSig_dibitsIndex;
      break;
    }
    bVar4 = bVar4 ^ voiceEmbSigRawBits[iVar1] ^ bVar5;
    iVar6 = *voiceEmbSig_dibitsIndex + 1;
    *voiceEmbSig_dibitsIndex = iVar6;
    uVar3 = uVar3 + 1;
  } while (uVar3 != 0x10);
  if (iVar6 == 0x40) {
    bVar2 = Hamming_16_11_4::decode(&this->m_hamming_16_11_4,voiceEmbSigRawBits,(uchar *)0x0,7);
    if (bVar2) {
      addresses->m_group =
           (uchar)(voiceEmbSigRawBits[6] * '\x02' +
                   voiceEmbSigRawBits[5] * '\x04' + voiceEmbSigRawBits[4] * '\b' +
                   voiceEmbSigRawBits[3] * '\x10' + voiceEmbSigRawBits[2] * ' ' +
                  voiceEmbSigRawBits[7]) == '\0';
      addresses->m_target =
           (uint)voiceEmbSigRawBits[0x45] +
           (uint)voiceEmbSigRawBits[0x41] * 0x10 +
           (uint)voiceEmbSigRawBits[0x40] * 0x20 +
           (uint)voiceEmbSigRawBits[0x39] * 0x40 + (uint)voiceEmbSigRawBits[0x38] * 0x80 +
           (uint)voiceEmbSigRawBits[0x37] * 0x100 +
           (uint)voiceEmbSigRawBits[0x36] * 0x200 +
           (uint)voiceEmbSigRawBits[0x35] * 0x400 +
           (uint)voiceEmbSigRawBits[0x34] * 0x800 + (uint)voiceEmbSigRawBits[0x33] * 0x1000 +
           (uint)voiceEmbSigRawBits[0x32] * 0x2000 +
           (uint)voiceEmbSigRawBits[0x31] * 0x4000 +
           (uint)voiceEmbSigRawBits[0x30] * 0x8000 + (uint)voiceEmbSigRawBits[0x29] * 0x10000 +
           (uint)voiceEmbSigRawBits[0x28] * 0x20000 +
           (uint)voiceEmbSigRawBits[0x27] * 0x40000 + (uint)voiceEmbSigRawBits[0x26] * 0x80000 +
           (uint)voiceEmbSigRawBits[0x25] * 0x100000 + (uint)voiceEmbSigRawBits[0x24] * 0x200000 +
           (uint)voiceEmbSigRawBits[0x23] * 0x400000 + (uint)voiceEmbSigRawBits[0x22] * 0x800000 +
           (uint)voiceEmbSigRawBits[0x42] * 8 + (uint)voiceEmbSigRawBits[0x43] * 4 +
           (uint)voiceEmbSigRawBits[0x44] * 2;
      addresses->m_source =
           (uint)voiceEmbSigRawBits[0x69] +
           (uint)voiceEmbSigRawBits[0x65] * 0x10 +
           (uint)voiceEmbSigRawBits[100] * 0x20 +
           (uint)voiceEmbSigRawBits[99] * 0x40 + (uint)voiceEmbSigRawBits[0x62] * 0x80 +
           (uint)voiceEmbSigRawBits[0x61] * 0x100 +
           (uint)voiceEmbSigRawBits[0x60] * 0x200 +
           (uint)voiceEmbSigRawBits[0x59] * 0x400 +
           (uint)voiceEmbSigRawBits[0x58] * 0x800 + (uint)voiceEmbSigRawBits[0x57] * 0x1000 +
           (uint)voiceEmbSigRawBits[0x56] * 0x2000 +
           (uint)voiceEmbSigRawBits[0x55] * 0x4000 +
           (uint)voiceEmbSigRawBits[0x54] * 0x8000 + (uint)voiceEmbSigRawBits[0x53] * 0x10000 +
           (uint)voiceEmbSigRawBits[0x52] * 0x20000 +
           (uint)voiceEmbSigRawBits[0x51] * 0x40000 + (uint)voiceEmbSigRawBits[0x50] * 0x80000 +
           (uint)voiceEmbSigRawBits[0x49] * 0x100000 + (uint)voiceEmbSigRawBits[0x48] * 0x200000 +
           (uint)voiceEmbSigRawBits[0x47] * 0x400000 + (uint)voiceEmbSigRawBits[0x46] * 0x800000 +
           (uint)voiceEmbSigRawBits[0x66] * 8 + (uint)voiceEmbSigRawBits[0x67] * 4 +
           (uint)voiceEmbSigRawBits[0x68] * 2;
      return true;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DSDDMR::processVoiceEmbeddedSignalling: decode error",0x34);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18));
    std::ostream::put('\0');
    std::ostream::flush();
    *voiceEmbSig_OK = false;
  }
  return false;
}

Assistant:

bool DSDDMR::processVoiceEmbeddedSignalling(int& voiceEmbSig_dibitsIndex,
        unsigned char *voiceEmbSigRawBits,
        bool& voiceEmbSig_OK,
        DMRAddresses& addresses)
{
    if (m_lcss != SingleLC_FirstCSBK) // skip RC
    {
        unsigned char parityCheck = 0;

        for (int i = 0; i < IN_DIBITS(DMR_ES_LEN); i++)
        {
            if (voiceEmbSig_dibitsIndex > 63) { // prevent segfault
                break;
            }

            int bit1Index = m_embSigInterleave[2*voiceEmbSig_dibitsIndex];
            int bit0Index = m_embSigInterleave[2*voiceEmbSig_dibitsIndex + 1];

            if ((i%4) == 0)
            {
                parityCheck = 0;
            }

            voiceEmbSigRawBits[bit1Index] = (1 & (m_voiceEmbSig_dibits[i] >> 1)); // bit 1
            voiceEmbSigRawBits[bit0Index] = (1 & m_voiceEmbSig_dibits[i]);        // bit 0
            parityCheck ^= voiceEmbSigRawBits[bit1Index];
            parityCheck ^= voiceEmbSigRawBits[bit0Index];

            if ((i%4) == 3)
            {
                if (parityCheck != 0)
                {
                    voiceEmbSig_OK = false;
                    break;
                }
            }

            voiceEmbSig_dibitsIndex++;
        }

        if (voiceEmbSig_dibitsIndex == 16*4) // BPTC matrix collected
        {
            if (m_hamming_16_11_4.decode(voiceEmbSigRawBits, 0, 7)) // TODO: 5 bit checksum
            {
                unsigned char flco = (voiceEmbSigRawBits[2] << 5)
                        + (voiceEmbSigRawBits[3] << 4)
                        + (voiceEmbSigRawBits[4] << 3)
                        + (voiceEmbSigRawBits[5] << 2)
                        + (voiceEmbSigRawBits[6] << 1)
                        + (voiceEmbSigRawBits[7]);
                addresses.m_group = (flco == 0);
                addresses.m_target = (voiceEmbSigRawBits[16*2 + 2] << 23) // (LC47)
                        + (voiceEmbSigRawBits[16*2 + 3] << 22)
                        + (voiceEmbSigRawBits[16*2 + 4] << 21)
                        + (voiceEmbSigRawBits[16*2 + 5] << 20)
                        + (voiceEmbSigRawBits[16*2 + 6] << 19)
                        + (voiceEmbSigRawBits[16*2 + 7] << 18)
                        + (voiceEmbSigRawBits[16*2 + 8] << 17)
                        + (voiceEmbSigRawBits[16*2 + 9] << 16) // 2:7
                        + (voiceEmbSigRawBits[16*3 + 0] << 15) // (LC39)
                        + (voiceEmbSigRawBits[16*3 + 1] << 14)
                        + (voiceEmbSigRawBits[16*3 + 2] << 13)
                        + (voiceEmbSigRawBits[16*3 + 3] << 12)
                        + (voiceEmbSigRawBits[16*3 + 4] << 11)
                        + (voiceEmbSigRawBits[16*3 + 5] << 10)
                        + (voiceEmbSigRawBits[16*3 + 6] << 9)
                        + (voiceEmbSigRawBits[16*3 + 7] << 8)  // 1:7
                        + (voiceEmbSigRawBits[16*3 + 8] << 7)  // (LC31)
                        + (voiceEmbSigRawBits[16*3 + 9] << 6)
                        + (voiceEmbSigRawBits[16*4 + 0] << 5)  // (LC29)
                        + (voiceEmbSigRawBits[16*4 + 1] << 4)
                        + (voiceEmbSigRawBits[16*4 + 2] << 3)
                        + (voiceEmbSigRawBits[16*4 + 3] << 2)
                        + (voiceEmbSigRawBits[16*4 + 4] << 1)
                        + (voiceEmbSigRawBits[16*4 + 5]);      // (LC24)
                addresses.m_source = (voiceEmbSigRawBits[16*4 + 6] << 23) // (LC23)
                        + (voiceEmbSigRawBits[16*4 + 7] << 22)
                        + (voiceEmbSigRawBits[16*4 + 8] << 21)
                        + (voiceEmbSigRawBits[16*4 + 9] << 20)
                        + (voiceEmbSigRawBits[16*5 + 0] << 19)
                        + (voiceEmbSigRawBits[16*5 + 1] << 18)
                        + (voiceEmbSigRawBits[16*5 + 2] << 17)
                        + (voiceEmbSigRawBits[16*5 + 3] << 16) // 2:7
                        + (voiceEmbSigRawBits[16*5 + 4] << 15) // (LC15)
                        + (voiceEmbSigRawBits[16*5 + 5] << 14)
                        + (voiceEmbSigRawBits[16*5 + 6] << 13)
                        + (voiceEmbSigRawBits[16*5 + 7] << 12)
                        + (voiceEmbSigRawBits[16*5 + 8] << 11)
                        + (voiceEmbSigRawBits[16*5 + 9] << 10)
                        + (voiceEmbSigRawBits[16*6 + 0] << 9)
                        + (voiceEmbSigRawBits[16*6 + 1] << 8)  // 1:7
                        + (voiceEmbSigRawBits[16*6 + 2] << 7)  // (LC7)
                        + (voiceEmbSigRawBits[16*6 + 3] << 6)
                        + (voiceEmbSigRawBits[16*6 + 4] << 5)
                        + (voiceEmbSigRawBits[16*6 + 5] << 4)
                        + (voiceEmbSigRawBits[16*6 + 6] << 3)
                        + (voiceEmbSigRawBits[16*6 + 7] << 2)
                        + (voiceEmbSigRawBits[16*6 + 8] << 1)
                        + (voiceEmbSigRawBits[16*6 + 9]);      // (LC0)

                return true; // we have a result
            }
            else
            {
                std::cerr << "DSDDMR::processVoiceEmbeddedSignalling: decode error" << std::endl;
                voiceEmbSig_OK = false;
            }
        }
    }

    return false; // no result yet or KO
}